

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGenericPoolAllocator.cpp
# Opt level: O0

bool __thiscall btGenericPoolAllocator::freeMemory(btGenericPoolAllocator *this,void *pointer)

{
  btGenericPoolAllocator *in_RDI;
  bool bVar1;
  size_t i;
  bool result;
  undefined7 in_stack_ffffffffffffffc8;
  ulong local_28;
  bool local_19;
  btGenericPoolAllocator *pointer_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  local_19 = false;
  pointer_00 = in_RDI;
  for (local_28 = 0; bVar1 = local_28 < in_RDI->m_pool_count, bVar1 && local_19 == false;
      local_28 = local_28 + 1) {
    local_19 = btGenericMemoryPool::freeMemory
                         ((btGenericMemoryPool *)
                          CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),pointer_00);
  }
  if (local_19 == false) {
    bVar1 = failback_free(in_RDI,(void *)CONCAT17(bVar1 && local_19 == false,
                                                  in_stack_ffffffffffffffc8));
  }
  else {
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool btGenericPoolAllocator::freeMemory(void * pointer)
{
	bool result = false;

	size_t i = 0;
	while(i<m_pool_count && result == false)
	{
		result = m_pools[i]->freeMemory(pointer);
		++i;
	}

	if(result) return true;

	return failback_free(pointer);
}